

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

LocalFederateId __thiscall
helics::CommonCore::registerFederate(CommonCore *this,string_view name,CoreFederateInfo *info)

{
  uint uVar1;
  pointer ppVar2;
  pointer pcVar3;
  size_type sVar4;
  string_view message;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar5;
  value<fmt::v11::context> *pvVar6;
  bool bVar7;
  FederateStates FVar8;
  IterationResult IVar9;
  int iVar10;
  size_type __n1;
  _Storage<unsigned_long,_true> _Var11;
  const_iterator cVar12;
  long lVar13;
  size_type sVar14;
  HelicsException *pHVar15;
  RegistrationFailure *pRVar16;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *p_Var17;
  char *pcVar18;
  size_t sVar19;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pair<int,_int> *prop;
  pointer ppVar20;
  FederateState *this_00;
  optional<unsigned_long> oVar21;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view name_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  handle feds;
  string nname;
  ActionMessage reg;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_198;
  value<fmt::v11::context> *local_190;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_188;
  _Storage<unsigned_long,_true> local_170;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_168;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_160;
  undefined1 local_158 [16];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_148;
  value<fmt::v11::context> *pvStack_140;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_138 [2];
  CoreFederateInfo *local_128;
  BrokerBase *local_120;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_118;
  value<fmt::v11::context> *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [3];
  SmallBuffer local_d8;
  size_t local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_1a8._M_str = name._M_str;
  local_1a8._M_len = name._M_len;
  bVar7 = waitCoreRegistration(this);
  if (!bVar7) {
    if (((this->super_BrokerBase).brokerState._M_i == ERRORED) &&
       ((this->super_BrokerBase).lastErrorString._M_string_length != 0)) {
      pRVar16 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      message_06._M_str = (this->super_BrokerBase).lastErrorString._M_dataplus._M_p;
      message_06._M_len = (this->super_BrokerBase).lastErrorString._M_string_length;
      RegistrationFailure::RegistrationFailure(pRVar16,message_06);
      __cxa_throw(pRVar16,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    pRVar16 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    pcVar18 = "core is unable to register and has timed out, federate cannot be registered";
    sVar19 = 0x4b;
LAB_00301abc:
    message_04._M_str = pcVar18;
    message_04._M_len = sVar19;
    RegistrationFailure::RegistrationFailure(pRVar16,message_04);
    __cxa_throw(pRVar16,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  if ((INITIALIZING < (this->super_BrokerBase).brokerState._M_i) &&
     ((this->super_BrokerBase).dynamicFederation == false)) {
    pRVar16 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    pcVar18 = "Core has already moved to operating state";
    sVar19 = 0x29;
    goto LAB_00301abc;
  }
  local_120 = &this->super_BrokerBase;
  __n1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_1a8,"${",0,2);
  local_148.values_ = (value<fmt::v11::context> *)local_138;
  pvStack_140 = (value<fmt::v11::context> *)0x0;
  local_138[0]._0_1_ = 0;
  if (__n1 != 0xffffffffffffffff) {
    local_168.values_ = (value<fmt::v11::context> *)local_1a8._M_str;
    local_160.values_ = (value<fmt::v11::context> *)local_1a8._M_len;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x9;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_168;
    ::fmt::v11::vformat_abi_cxx11_((string *)&local_198,(v11 *)"rename:{}",fmt,args);
    in_R9 = local_198;
    (*(this->super_Core)._vptr_Core[0x5e])(&local_118,this,4,"root",local_190,local_198.values_,0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.values_ != local_108) {
      operator_delete(local_118.values_,(ulong)(local_108[0]._M_allocated_capacity + 1));
    }
    if (&(local_198.values_)->field_0 != &local_188) {
      operator_delete(local_198.values_,(ulong)(local_188.long_long_value + 1));
    }
    pvVar6 = pvStack_140;
    aVar5 = local_148;
    if ((value<fmt::v11::context> *)local_1a8._M_len == pvStack_140) {
      if ((value<fmt::v11::context> *)local_1a8._M_len != (value<fmt::v11::context> *)0x0) {
        iVar10 = bcmp(local_1a8._M_str,local_148.values_,local_1a8._M_len);
        if (iVar10 != 0) goto LAB_003017dd;
      }
    }
    else {
LAB_003017dd:
      __str._M_str = (char *)aVar5.values_;
      __str._M_len = (size_t)pvVar6;
      iVar10 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_1a8,0,__n1,
                          __str);
      if (iVar10 != 0) {
        sVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_148,"error",0,5);
        if (sVar14 != 0xffffffffffffffff) {
          pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
          message_07._M_str =
               "automatic naming resulting in failure, may not be supported by broker";
          message_07._M_len = 0x45;
          HelicsException::HelicsException(pHVar15,message_07);
          *(undefined ***)pHVar15 = &PTR__HelicsException_0053ea50;
          __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
        }
      }
      pcVar3 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar4 = (this->super_BrokerBase).identifier._M_string_length;
      local_118.values_ = (value<fmt::v11::context> *)local_1a8._M_str;
      local_110 = (value<fmt::v11::context> *)local_1a8._M_len;
      local_108[0]._M_allocated_capacity = local_148;
      local_108[0]._8_8_ = pvStack_140;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = (char *)0x1d;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_118;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_198,(v11 *)"generated name for fed {}->{}",fmt_00,args_00);
      local_60 = (size_t)local_190;
      aStack_58.args_ = local_198.args_;
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message._M_str = (char *)local_198.values_;
      message._M_len = (size_t)local_190;
      name_00._M_str = pcVar3;
      name_00._M_len = sVar4;
      BrokerBase::sendToLogger(local_120,(GlobalFederateId)0x0,6,name_00,message,false);
      if (&(local_198.values_)->field_0 != &local_188) {
        operator_delete(local_198.values_,(ulong)(local_188.long_long_value + 1));
      }
      local_1a8._M_str = (char *)local_148;
      local_1a8._M_len = (size_t)pvStack_140;
    }
  }
  local_168.values_ = (value<fmt::v11::context> *)&this->federates;
  local_160.values_ = (value<fmt::v11::context> *)&(this->federates).m_mutex;
  local_158[0] = 0;
  std::unique_lock<std::shared_mutex>::lock((unique_lock<std::shared_mutex> *)&local_160);
  aVar5 = local_168;
  local_158[0] = 1;
  if ((this->super_BrokerBase).maxFederateCount <=
      (int)((ulong)((long)((local_168.values_)->field_0).custom.format -
                   ((local_168.values_)->field_0).long_long_value) >> 3)) {
    pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
    message_00._M_str = "maximum number of federates in the core has been reached";
    message_00._M_len = 0x38;
    HelicsException::HelicsException(pHVar15,message_00);
    *(undefined ***)pHVar15 = &PTR__HelicsException_0053ea50;
    __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  local_118.values_ = (value<fmt::v11::context> *)local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,local_1a8._M_str,
             (long)(anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)local_1a8._M_len +
             (long)(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                   local_1a8._M_str);
  local_198.values_ = (value<fmt::v11::context> *)&local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,local_1a8._M_str,
             (long)(anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)local_1a8._M_len +
             (long)(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                   local_1a8._M_str);
  local_128 = info;
  oVar21 = gmlc::containers::MappedPointerVector<helics::FederateState,std::__cxx11::string>::
           insert<std::__cxx11::string,helics::CoreFederateInfo_const&>
                     ((MappedPointerVector<helics::FederateState,std::__cxx11::string> *)
                      aVar5.values_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_118,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_198,info);
  _Var11._M_value =
       oVar21.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (local_198.values_ != (value<fmt::v11::context> *)&local_188) {
    operator_delete(local_198.values_,(ulong)(local_188.long_long_value + 1));
  }
  if (local_118.values_ != (value<fmt::v11::context> *)local_108) {
    operator_delete(local_118.values_,(ulong)(local_108[0]._M_allocated_capacity + 1));
  }
  aVar5 = local_168;
  if (((undefined1  [16])
       oVar21.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    if ((this->super_BrokerBase).dynamicFederation != true) {
      pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
      local_198.values_ = (value<fmt::v11::context> *)local_1a8._M_str;
      local_190 = (value<fmt::v11::context> *)local_1a8._M_len;
      fmt_02.size_ = 0xd;
      fmt_02.data_ = (char *)0x42;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&local_198;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_118,
                 (v11 *)"duplicate names {} detected: multiple federates with the same name",fmt_02,
                 args_02);
      message_05._M_str = (char *)local_118.values_;
      message_05._M_len = (size_t)local_110;
      HelicsException::HelicsException(pHVar15,message_05);
      *(undefined ***)pHVar15 = &PTR__HelicsException_0053ea50;
      __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    local_118.values_ = (value<fmt::v11::context> *)local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,local_1a8._M_str,
               (long)(anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)local_1a8._M_len +
               (long)(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                     local_1a8._M_str);
    cVar12 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((MappedPointerVector<helics::FederateState,std::__cxx11::string> *)
                        (aVar5.values_ + 1) + 8),(key_type *)&local_118);
    if (cVar12.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = (FederateState *)0x0;
    }
    else {
      this_00 = *(FederateState **)
                 ((long)((aVar5.values_)->field_0).pointer +
                 *(long *)((long)cVar12.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28) * 8);
    }
    if (local_118.values_ != (value<fmt::v11::context> *)local_108) {
      operator_delete(local_118.values_,(ulong)(local_108[0]._M_allocated_capacity + 1));
    }
    local_170._M_value._4_4_ = 0;
    local_170._M_value._0_4_ = (this_00->local_id).fid;
    bVar7 = FederateState::getOptionFlag(this_00,0x26);
    if (!bVar7) {
LAB_0030199e:
      pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
      local_198 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  local_1a8._M_str;
      local_190 = (value<fmt::v11::context> *)local_1a8._M_len;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x42;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_198;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_118,
                 (v11 *)"duplicate names {} detected: multiple federates with the same name",fmt_01,
                 args_01);
      message_02._M_str = (char *)local_118.values_;
      message_02._M_len = (size_t)local_110;
      HelicsException::HelicsException(pHVar15,message_02);
      *(undefined ***)pHVar15 = &PTR__HelicsException_0053ea50;
      __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    FVar8 = FederateState::getState(this_00);
    if (FVar8 != FINISHED) goto LAB_0030199e;
    lVar13 = ((local_168.values_)->field_0).long_long_value;
    p_Var17 = ((local_168.values_)->field_0).custom.format;
  }
  else {
    lVar13 = ((local_168.values_)->field_0).long_long_value;
    p_Var17 = ((local_168.values_)->field_0).custom.format;
    local_170._M_value = _Var11._M_value;
    if ((ulong)_Var11 < (ulong)((long)p_Var17 - lVar13 >> 3)) {
      this_00 = *(FederateState **)(lVar13 + _Var11._M_value * 8);
    }
    else {
      this_00 = (FederateState *)0x0;
    }
  }
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)&local_160);
  if (this_00 == (FederateState *)0x0) {
    pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
    message_01._M_str = "unknown allocation error occurred";
    message_01._M_len = 0x21;
    HelicsException::HelicsException(pHVar15,message_01);
    *(undefined ***)pHVar15 = &PTR__HelicsException_0053ea50;
    __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  if (((undefined1  [16])
       oVar21.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    FederateState::reset(this_00,local_128);
  }
  else {
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:775:24)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:775:24)>
               ::_M_manager;
    local_50._M_unused._M_object = this;
    FederateState::setLogger
              (this_00,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    (this_00->local_id).fid = (BaseType)local_170._M_value;
    this_00->mParent = this;
    if ((this->super_BrokerBase).enable_profiling == true) {
      FederateState::setOptionFlag(this_00,0x5d,true);
    }
  }
  ActionMessage::ActionMessage((ActionMessage *)&local_118,cmd_reg_fed);
  pcVar18 = local_1a8._M_str;
  local_d8.bufferSize = local_1a8._M_len;
  if (local_d8.heap == (byte *)local_1a8._M_str) {
  }
  else {
    SmallBuffer::reserve(&local_d8,local_1a8._M_len);
    if ((value<fmt::v11::context> *)local_d8.bufferSize != (value<fmt::v11::context> *)0x0) {
      memcpy(local_d8.heap,pcVar18,local_d8.bufferSize);
    }
  }
  if ((this->super_BrokerBase).observer == false) {
    bVar7 = FederateState::getOptionFlag(this_00,0);
    if (!bVar7) goto LAB_0030161a;
  }
  local_108[0]._8_8_ = local_108[0]._8_8_ | 0x1000000;
LAB_0030161a:
  bVar7 = FederateState::getOptionFlag(this_00,0x26);
  if (bVar7) {
    local_108[0]._8_8_ = local_108[0]._8_8_ | 0x4000000;
  }
  if (0 < this_00->indexGroup) {
    local_108[0]._8_2_ = (short)this_00->indexGroup;
  }
  BrokerBase::addActionMessage(local_120,(ActionMessage *)&local_118);
  if (((long)p_Var17 - lVar13 == 8 &
      oVar21.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged) != 0) {
    ppVar2 = (local_128->intProps).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar20 = (local_128->intProps).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar2;
        ppVar20 = ppVar20 + 1) {
      uVar1 = ppVar20->first - 0x10f;
      if ((uVar1 < 4) && (uVar1 != 2)) {
        setIntegerProperty(this,(LocalFederateId)0xfffffefd,ppVar20->first,(int16_t)ppVar20->second)
        ;
      }
    }
  }
  IVar9 = FederateState::waitSetup(this_00);
  if (IVar9 == NEXT_STEP) {
    ActionMessage::~ActionMessage((ActionMessage *)&local_118);
    if ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)local_148.values_ !=
        local_138) {
      operator_delete(local_148.values_,CONCAT71(local_138[0]._1_7_,local_138[0]._0_1_) + 1);
    }
    return (LocalFederateId)(BaseType)local_170._M_value;
  }
  pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
  local_168.values_ = (value<fmt::v11::context> *)local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"fed received Failure ","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
                 &this_00->errorString);
  message_03._M_str = (char *)local_198.values_;
  message_03._M_len = (size_t)local_190;
  HelicsException::HelicsException(pHVar15,message_03);
  *(undefined ***)pHVar15 = &PTR__HelicsException_0053ea50;
  __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

LocalFederateId CommonCore::registerFederate(std::string_view name, const CoreFederateInfo& info)
{
    if (!waitCoreRegistration()) {
        if (getBrokerState() == BrokerState::ERRORED) {
            if (!lastErrorString.empty()) {
                throw(RegistrationFailure(lastErrorString));
            }
        }
        throw(RegistrationFailure(
            "core is unable to register and has timed out, federate cannot be registered"));
    }
    if (getBrokerState() >= BrokerState::OPERATING) {
        if (!dynamicFederation) {
            throw(RegistrationFailure("Core has already moved to operating state"));
        }
    }
    auto iloc = name.find("${");
    std::string nname;
    if (iloc != std::string_view::npos) {
        /** this will block*/
        nname = query("root",
                      fmt::format("rename:{}", name),
                      HelicsSequencingModes::HELICS_SEQUENCING_MODE_FAST);
        if (name != nname) {
            if (name.compare(0, iloc, nname) != 0 && nname.find("error") != std::string::npos) {
                throw(RegistrationFailure(
                    "automatic naming resulting in failure, may not be supported by broker"));
            }
            sendToLogger(parent_broker_id,
                         HELICS_LOG_LEVEL_SUMMARY,
                         getIdentifier(),
                         fmt::format("generated name for fed {}->{}", name, nname));
            name = nname;
        }
    }
    FederateState* fed = nullptr;
    bool checkProperties{false};
    bool newFed{true};
    LocalFederateId local_id;
    {
        auto feds = federates.lock();
        if (static_cast<decltype(maxFederateCount)>(feds->size()) >= maxFederateCount) {
            throw(RegistrationFailure("maximum number of federates in the core has been reached"));
        }

        auto fedid = feds->insert(std::string(name), std::string(name), info);
        if (fedid) {
            local_id = LocalFederateId(static_cast<int32_t>(*fedid));
            fed = (*feds)[*fedid];
        } else {
            if (dynamicFederation) {
                fed = feds->find(std::string(name));
                local_id = fed->local_id;
                if (!fed->getOptionFlag(HELICS_FLAG_REENTRANT) ||
                    fed->getState() != FederateStates::FINISHED) {
                    throw(RegistrationFailure(fmt::format(
                        "duplicate names {} detected: multiple federates with the same name",
                        name)));
                }
                newFed = false;
            } else {
                throw(RegistrationFailure(fmt::format(
                    "duplicate names {} detected: multiple federates with the same name", name)));
            }
        }

        if (feds->size() == 1 && newFed) {
            checkProperties = true;
        }
    }
    if (fed == nullptr) {
        throw(RegistrationFailure("unknown allocation error occurred"));
    }
    if (newFed) {
        // setting up the Logger
        // auto ptr = fed.get();
        // if we are using the Logger, log all messages coming from the federates so they can
        // control the level*/
        fed->setLogger([this](int level, std::string_view ident, std::string_view message) {
            sendToLogger(parent_broker_id, LogLevels::FED + level, ident, message);
        });

        fed->local_id = local_id;
        fed->setParent(this);
        if (enable_profiling) {
            fed->setOptionFlag(defs::PROFILING, true);
        }
    } else {
        fed->reset(info);
    }
    ActionMessage reg(CMD_REG_FED);
    reg.name(name);
    if (observer || fed->getOptionFlag(HELICS_FLAG_OBSERVER)) {
        setActionFlag(reg, observer_flag);
    }
    if (fed->getOptionFlag(HELICS_FLAG_REENTRANT)) {
        setActionFlag(reg, reentrant_flag);
    }
    if (fed->indexGroup > 0) {
        reg.counter = static_cast<int16_t>(fed->indexGroup);
    }
    addActionMessage(reg);
    // check some properties that should be inherited from the federate if it is the first one
    if (checkProperties) {
        // if this is the first federate then the core should inherit the logging level properties
        for (const auto& prop : info.intProps) {
            switch (prop.first) {
                case defs::Properties::LOG_LEVEL:
                case defs::Properties::FILE_LOG_LEVEL:
                case defs::Properties::CONSOLE_LOG_LEVEL:
                    setIntegerProperty(gLocalCoreId, prop.first, static_cast<int16_t>(prop.second));
                    break;
                default:
                    break;
            }
        }
    }
    // now wait for the federateQueue to get the response
    auto valid = fed->waitSetup();
    if (valid == IterationResult::NEXT_STEP) {
        return local_id;
    }
    throw(RegistrationFailure(std::string("fed received Failure ") + fed->lastErrorString()));
}